

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBodyInternals.h
# Opt level: O2

btMatrix3x3 *
MassMatrix(btMatrix3x3 *__return_storage_ptr__,btScalar im,btMatrix3x3 *iwi,btVector3 *r)

{
  btMatrix3x3 *r_1;
  long lVar1;
  btVector3 bVar2;
  btMatrix3x3 m;
  undefined1 local_d8 [20];
  btScalar local_c4;
  undefined8 local_c0;
  undefined8 uStack_b8;
  btScalar local_b0;
  undefined4 local_ac;
  btMatrix3x3 local_a8;
  btMatrix3x3 local_78;
  btMatrix3x3 local_48;
  
  local_48.m_el[0].m_floats[2] = r->m_floats[1];
  local_48.m_el[1].m_floats[0] = r->m_floats[2];
  local_48.m_el[0].m_floats[1] = -local_48.m_el[1].m_floats[0];
  local_48.m_el[0].m_floats[0] = 0.0;
  local_48.m_el[0].m_floats[3] = 0.0;
  local_48.m_el[2].m_floats[1] = r->m_floats[0];
  local_48.m_el[1].m_floats[2] = -local_48.m_el[2].m_floats[1];
  local_48.m_el[1].m_floats[1] = 0.0;
  local_48.m_el[1].m_floats[3] = 0.0;
  local_48.m_el[2].m_floats[0] = -local_48.m_el[0].m_floats[2];
  local_48.m_el[2].m_floats[2] = 0.0;
  local_48.m_el[2].m_floats[3] = 0.0;
  local_d8._4_8_ = 0;
  local_d8._12_8_ = 0;
  local_c0 = 0;
  uStack_b8 = 0;
  local_ac = 0;
  local_d8._0_4_ = im;
  local_c4 = im;
  local_b0 = im;
  operator*(&local_78,&local_48,iwi);
  operator*(&local_a8,&local_78,&local_48);
  for (lVar1 = 0; lVar1 != 0x30; lVar1 = lVar1 + 0x10) {
    bVar2 = operator-((btVector3 *)(local_d8 + lVar1),
                      (btVector3 *)((long)local_a8.m_el[0].m_floats + lVar1));
    *(btScalar (*) [4])((long)__return_storage_ptr__->m_el[0].m_floats + lVar1) = bVar2.m_floats;
  }
  return __return_storage_ptr__;
}

Assistant:

static inline btMatrix3x3	MassMatrix(btScalar im,const btMatrix3x3& iwi,const btVector3& r)
{
	const btMatrix3x3	cr=Cross(r);
	return(Sub(Diagonal(im),cr*iwi*cr));
}